

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

int64_t docio_read_doc_key_meta
                  (docio_handle *handle,uint64_t offset,docio_object *doc,bool read_on_cache_miss)

{
  ushort uVar1;
  err_log_callback *log_callback;
  undefined8 uVar2;
  uint8_t uVar3;
  byte bVar4;
  uint64_t uVar5;
  ulong uVar6;
  void *buf_out;
  void *pvVar7;
  fdb_status status;
  size_t sVar8;
  filemgr *pfVar9;
  char *format;
  char *pcVar10;
  bool key_alloc;
  bool bVar11;
  bool bVar12;
  bool meta_alloc;
  undefined1 auVar13 [16];
  docio_length dVar14;
  undefined8 uVar15;
  timestamp_t _timestamp;
  docio_length _length;
  fdb_seqnum_t _seqnum;
  undefined1 local_48 [16];
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  log_callback = handle->log_callback;
  uVar5 = _docio_read_length(handle,offset,&_length,log_callback,read_on_cache_miss);
  dVar14 = _length;
  if ((long)uVar5 < 0) {
    if (!read_on_cache_miss) {
      return uVar5;
    }
    fdb_log_impl(log_callback,2,(fdb_status)uVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",0x465,
                 "Error in reading the doc length metadata with offset %lu from a database file \'%s\'"
                 ,offset,handle->file->filename);
    return uVar5;
  }
  local_48 = (undefined1  [16])0x0;
  uVar3 = _length.checksum;
  auVar13[0] = -((char)_length.keylen == '\0');
  auVar13[1] = -(_length.keylen._1_1_ == '\0');
  auVar13[2] = -((char)_length.metalen == '\0');
  auVar13[3] = -(_length.metalen._1_1_ == '\0');
  auVar13[4] = -((char)_length.bodylen == '\0');
  auVar13[5] = -(_length.bodylen._1_1_ == '\0');
  auVar13[6] = -(_length.bodylen._2_1_ == '\0');
  auVar13[7] = -(_length.bodylen._3_1_ == '\0');
  auVar13[8] = -((char)_length.bodylen_ondisk == '\0');
  auVar13[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
  auVar13[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
  auVar13[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
  auVar13[0xc] = -(_length.flag == '\0');
  auVar13[0xd] = -(_length.checksum == '\0');
  auVar13[0xe] = -((char)_length.reserved == '\0');
  auVar13[0xf] = -(_length.reserved._1_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      == 0xffff) {
    (doc->length).keylen = 0;
    (doc->length).metalen = 0;
    (doc->length).bodylen = 0;
    (doc->length).bodylen_ondisk = 0;
    (doc->length).flag = '\0';
    (doc->length).checksum = '\0';
    (doc->length).reserved = 0;
    return 0;
  }
  uVar15 = _length._0_8_;
  uVar2 = _length._8_8_;
  bVar4 = _docio_length_checksum(_length,handle);
  if (bVar4 != uVar3) {
    fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",0x47a,
                 "doc_length meta checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                 ,handle->file->filename,(ulong)bVar4,(ulong)uVar2 >> 0x28 & 0xff,uVar15 & 0xffff,
                 (ulong)uVar15 >> 0x10 & 0xffff,(ulong)uVar15 >> 0x20,uVar2,offset);
    return -0xf;
  }
  dVar14 = _docio_length_decode(dVar14);
  uVar6 = dVar14._0_8_;
  doc->length = dVar14;
  if ((ushort)(dVar14.keylen + 0xf) < 0x10) {
    fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",0x482,
                 "Error in decoding the doc length metadata (key length: %d) from a database file \'%s\'"
                 ,uVar6 & 0xffff,handle->file->filename);
    return -0x10;
  }
  buf_out = doc->key;
  key_alloc = buf_out == (void *)0x0;
  if (key_alloc) {
    buf_out = malloc(uVar6 & 0xffff);
    doc->key = buf_out;
  }
  bVar11 = doc->meta == (void *)0x0;
  bVar12 = dVar14.metalen != 0;
  meta_alloc = bVar12 && bVar11;
  if (meta_alloc) {
    pvVar7 = malloc(uVar6 >> 0x10 & 0xffff);
    doc->meta = pvVar7;
  }
  uVar5 = _docio_read_doc_component(handle,uVar5,dVar14._0_4_ & 0xffff,buf_out,log_callback);
  if ((long)uVar5 < 0) {
    uVar1 = (doc->length).keylen;
    pfVar9 = handle->file;
    pcVar10 = "Error in reading a key with offset %lu, length %d from a database file \'%s\'";
    sVar8 = 0x495;
LAB_0012562b:
    fdb_log_impl(log_callback,2,(fdb_status)uVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",sVar8,pcVar10,offset,(ulong)uVar1,pfVar9->filename);
  }
  else {
    uVar5 = _docio_read_doc_component(handle,uVar5,4,&_timestamp,log_callback);
    if ((long)uVar5 < 0) {
      format = "Error in reading a timestamp with offset %lu, length %d from a database file \'%s\'"
      ;
      sVar8 = 0x4a2;
      status = (fdb_status)uVar5;
      pcVar10 = handle->file->filename;
      uVar15 = 4;
    }
    else {
      doc->timestamp =
           _timestamp >> 0x18 | (_timestamp & 0xff0000) >> 8 | (_timestamp & 0xff00) << 8 |
           _timestamp << 0x18;
      uVar5 = _docio_read_doc_component(handle,uVar5,8,&_seqnum,log_callback);
      if (-1 < (long)uVar5) {
        (doc->field_3).seqnum =
             _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
             (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
             (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 | (_seqnum & 0xff00) << 0x28
             | _seqnum << 0x38;
        uVar5 = _docio_read_doc_component
                          (handle,uVar5,(uint)(doc->length).metalen,doc->meta,log_callback);
        if (-1 < (long)uVar5) {
          if (bVar12 && bVar11) {
            meta_alloc = (doc->length).metalen == 0;
          }
          else {
            meta_alloc = false;
          }
          key_alloc = false;
          goto LAB_00125714;
        }
        uVar1 = (doc->length).metalen;
        pfVar9 = handle->file;
        pcVar10 = 
        "Error in reading the doc metadata with offset %lu, length %d from a database file \'%s\'";
        sVar8 = 0x4bb;
        goto LAB_0012562b;
      }
      format = 
      "Error in reading a sequence number with offset %lu, length %d from a database file \'%s\'";
      sVar8 = 0x4af;
      status = (fdb_status)uVar5;
      pcVar10 = handle->file->filename;
      uVar15 = 8;
    }
    fdb_log_impl(log_callback,2,status,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key_meta",sVar8,format,offset,uVar15,pcVar10);
  }
LAB_00125714:
  free_docio_object(doc,key_alloc,meta_alloc,'\0');
  return uVar5;
}

Assistant:

int64_t docio_read_doc_key_meta(struct docio_handle *handle, uint64_t offset,
                                struct docio_object *doc,
                                bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length meta checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s'", doc->length.keylen, handle->file->filename);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset, doc->length.keylen,
                                        doc->key, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy sequence number (optional)
    _offset = _docio_read_doc_component(handle, _offset, sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, 0);
        return _offset;
    }

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    free_docio_object(doc, 0, free_meta, 0);

    return _offset;
}